

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void arm::display_op(OpCode op,ostream *o)

{
  ostream *this;
  ostream *in_RSI;
  int in_EDI;
  
  switch(in_EDI) {
  case 0:
    std::operator<<(in_RSI,"nop");
    break;
  case 1:
    std::operator<<(in_RSI,"b");
    break;
  case 2:
    std::operator<<(in_RSI,"bl");
    break;
  case 3:
    std::operator<<(in_RSI,"bx");
    break;
  case 4:
    std::operator<<(in_RSI,"cbz");
    break;
  case 5:
    std::operator<<(in_RSI,"cbnz");
    break;
  case 6:
    std::operator<<(in_RSI,"mov");
    break;
  case 7:
    std::operator<<(in_RSI,"movt");
    break;
  case 8:
    std::operator<<(in_RSI,"mvn");
    break;
  case 9:
    std::operator<<(in_RSI,"add");
    break;
  case 10:
    std::operator<<(in_RSI,"sub");
    break;
  case 0xb:
    std::operator<<(in_RSI,"rsb");
    break;
  case 0xc:
    std::operator<<(in_RSI,"mul");
    break;
  case 0xd:
    std::operator<<(in_RSI,"smmul");
    break;
  case 0xe:
    std::operator<<(in_RSI,"mla");
    break;
  case 0xf:
    std::operator<<(in_RSI,"smmla");
    break;
  case 0x10:
    std::operator<<(in_RSI,"sdiv");
    break;
  case 0x11:
    std::operator<<(in_RSI,"and");
    break;
  case 0x12:
    std::operator<<(in_RSI,"orr");
    break;
  case 0x13:
    std::operator<<(in_RSI,"eor");
    break;
  case 0x14:
    std::operator<<(in_RSI,"bic");
    break;
  case 0x15:
    std::operator<<(in_RSI,"lsl");
    break;
  case 0x16:
    std::operator<<(in_RSI,"lsr");
    break;
  case 0x17:
    std::operator<<(in_RSI,"asr");
    break;
  case 0x18:
    std::operator<<(in_RSI,"cmp");
    break;
  case 0x19:
    std::operator<<(in_RSI,"cmn");
    break;
  case 0x1a:
    std::operator<<(in_RSI,"ldr");
    break;
  case 0x1b:
    std::operator<<(in_RSI,"ldm");
    break;
  case 0x1c:
    std::operator<<(in_RSI,"str");
    break;
  case 0x1d:
    std::operator<<(in_RSI,"stm");
    break;
  case 0x1e:
    std::operator<<(in_RSI,"push");
    break;
  case 0x1f:
    std::operator<<(in_RSI,"pop");
    break;
  case 0x20:
    break;
  default:
    this = std::operator<<(in_RSI,"?");
    std::ostream::operator<<(this,in_EDI);
    break;
  case 0x22:
    std::operator<<(in_RSI,"_MOD");
  }
  return;
}

Assistant:

void display_op(OpCode op, std::ostream &o) {
  switch (op) {
    case OpCode::Nop:
      o << "nop";
      break;
    case OpCode::B:
      o << "b";
      break;
    case OpCode::Bl:
      o << "bl";
      break;
    case OpCode::Bx:
      o << "bx";
      break;
    case OpCode::Cbz:
      o << "cbz";
      break;
    case OpCode::Cbnz:
      o << "cbnz";
      break;
    case OpCode::Mov:
      o << "mov";
      break;
    case OpCode::MovT:
      o << "movt";
      break;
    case OpCode::Mvn:
      o << "mvn";
      break;
    case OpCode::Add:
      o << "add";
      break;
    case OpCode::Sub:
      o << "sub";
      break;
    case OpCode::Rsb:
      o << "rsb";
      break;
    case OpCode::Mul:
      o << "mul";
      break;
    case OpCode::SMMul:
      o << "smmul";
      break;
    case OpCode::Mla:
      o << "mla";
      break;
    case OpCode::SMMla:
      o << "smmla";
      break;
    case OpCode::SDiv:
      o << "sdiv";
      break;
    case OpCode::Lsl:
      o << "lsl";
      break;
    case OpCode::Lsr:
      o << "lsr";
      break;
    case OpCode::Asr:
      o << "asr";
      break;
    case OpCode::And:
      o << "and";
      break;
    case OpCode::Orr:
      o << "orr";
      break;
    case OpCode::Eor:
      o << "eor";
      break;
    case OpCode::Bic:
      o << "bic";
      break;
    case OpCode::Cmp:
      o << "cmp";
      break;
    case OpCode::Cmn:
      o << "cmn";
      break;
    case OpCode::LdR:
      o << "ldr";
      break;
    case OpCode::LdM:
      o << "ldm";
      break;
    case OpCode::StR:
      o << "str";
      break;
    case OpCode::StM:
      o << "stm";
      break;
    case OpCode::Push:
      o << "push";
      break;
    case OpCode::Pop:
      o << "pop";
      break;
    case OpCode::_Label:
      // Labels are pseudo-instructions
      break;
    case OpCode::_Mod:
      o << "_MOD";
      break;
    default:
      o << "?" << (int)op;
      break;
  }
}